

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall wasm_exporttype_t::wasm_exporttype_t(wasm_exporttype_t *this,ExportType *et)

{
  pointer pcVar1;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_20;
  
  (this->I).name._M_dataplus._M_p = (pointer)&(this->I).name.field_2;
  pcVar1 = (et->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (et->name)._M_string_length);
  (*((et->type)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&(this->I).type);
  (*((et->type)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_20);
  wasm_externtype_t::New((wasm_externtype_t *)&this->extern_,&local_20);
  if (local_20._M_t.
      super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
      .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>)0x0
     ) {
    (**(code **)(*(long *)local_20._M_t.
                          super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                          .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl + 8
                ))();
  }
  pcVar1 = (this->I).name._M_dataplus._M_p;
  (this->name).size = (this->I).name._M_string_length;
  (this->name).data = pcVar1;
  return;
}

Assistant:

wasm_exporttype_t(ExportType et)
      : I(et),
        extern_{wasm_externtype_t::New(et.type->Clone())},
        name{I.name.size(), const_cast<wasm_byte_t*>(I.name.data())} {}